

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  int iVar1;
  PyObject *pPVar2;
  handle *phVar3;
  PyTypeObject *pPVar4;
  handle local_58;
  PyObject *local_50;
  handle local_48;
  PyTypeObject *local_40;
  PyTypeObject *type;
  PyTypeObject *local_28;
  PyHeapTypeObject *heap_type;
  handle local_18;
  object name_obj;
  char *name;
  
  name_obj.super_handle.m_ptr = (handle)anon_var_dwarf_33c00;
  pPVar2 = (PyObject *)PyUnicode_FromString();
  handle::handle((handle *)&heap_type,pPVar2);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_18,(handle)heap_type);
  local_28 = (PyTypeObject *)(*_PyFrame_GetLineNumber)(&PyType_Type,0);
  if (local_28 == (PyTypeObject *)0x0) {
    pybind11_fail("make_default_metaclass(): error allocating metaclass!");
  }
  phVar3 = handle::inc_ref(&local_18);
  pPVar2 = handle::ptr(phVar3);
  local_28[2].tp_basicsize = (Py_ssize_t)pPVar2;
  phVar3 = handle::inc_ref(&local_18);
  pPVar2 = handle::ptr(phVar3);
  local_28[2].tp_dealloc = (destructor)pPVar2;
  local_40 = local_28;
  local_28->tp_name = "pybind11_type";
  pPVar4 = type_incref((PyTypeObject *)&PyType_Type);
  local_40->tp_base = pPVar4;
  local_40->tp_flags = 0x600;
  local_40->tp_call = pybind11_meta_call;
  local_40->tp_setattro = pybind11_meta_setattro;
  local_40->tp_getattro = pybind11_meta_getattro;
  local_40->tp_dealloc = pybind11_meta_dealloc;
  iVar1 = PyType_Ready(local_40);
  if (iVar1 < 0) {
    pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
  }
  handle::handle(&local_48,(PyObject *)local_40);
  str::str((str *)&local_58,"pybind11_builtins");
  local_50 = local_58.m_ptr;
  setattr(local_48,"__module__",local_58);
  str::~str((str *)&local_58);
  pPVar4 = local_40;
  object::~object((object *)&local_18);
  return pPVar4;
}

Assistant:

inline PyTypeObject* make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyType_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_call = pybind11_meta_call;

    type->tp_setattro = pybind11_meta_setattro;
#if PY_MAJOR_VERSION >= 3
    type->tp_getattro = pybind11_meta_getattro;
#endif

    type->tp_dealloc = pybind11_meta_dealloc;

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}